

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O1

bool __thiscall SendReceiver::uploadFile(SendReceiver *this,char *pathToFile)

{
  int iVar1;
  path *ppVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  path *ppVar7;
  ifstream *_in;
  undefined1 uVar8;
  curl_httppost *formpost;
  curl_httppost *lastptr;
  char *pathToFile_local;
  string filename;
  SendReceiver handler;
  string contents;
  string data;
  string local_258;
  ifstream in;
  size_type local_230;
  
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  contents._M_string_length = 0;
  contents.field_2._M_local_buf[0] = '\0';
  pathToFile_local = pathToFile;
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  data._M_dataplus._M_p = (pointer)&data.field_2;
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            ((path *)&handler,&pathToFile_local,auto_format);
  if (handler.super_JHandler.url_ptr.super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00106765:
    std::filesystem::__cxx11::path::path((path *)&in);
  }
  else {
    ppVar2 = (path *)&handler;
    if ((~(byte)handler.super_JHandler.error_msg._M_dataplus._M_p & 3) != 0) {
      if ((((ulong)handler.super_JHandler.error_msg._M_dataplus._M_p & 3) == 0) &&
         ((handler.super_JHandler.url_ptr.
           super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr[-1].str_short.
           field_2._M_local_buf + 0xf)
          [(long)handler.super_JHandler.url_ptr.
                 super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi] !=
          '/')) {
        if (((ulong)handler.super_JHandler.error_msg._M_dataplus._M_p & 3) == 0) {
          ppVar2 = (path *)std::filesystem::__cxx11::path::_List::end();
        }
        else {
          ppVar2 = (path *)0x0;
        }
        ppVar7 = (path *)&ppVar2[-2]._M_cmpts;
        if (((ulong)handler.super_JHandler.error_msg._M_dataplus._M_p & 3) != 0) {
          ppVar7 = ppVar2;
        }
        ppVar2 = (path *)&handler.super_JHandler;
        if (((ulong)handler.super_JHandler.error_msg._M_dataplus._M_p & 3) == 0) {
          ppVar2 = ppVar7;
        }
        if ((~*(uint *)&(((string *)&ppVar2->_M_cmpts)->_M_dataplus)._M_p & 3) == 0) {
          ppVar2 = (path *)&handler;
          if (((ulong)handler.super_JHandler.error_msg._M_dataplus._M_p & 3) == 0) {
            ppVar2 = ppVar7;
          }
          goto LAB_00106753;
        }
      }
      goto LAB_00106765;
    }
LAB_00106753:
    std::filesystem::__cxx11::path::path((path *)&in,ppVar2);
  }
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,_in,_in + local_230);
  std::filesystem::__cxx11::path::~path((path *)&in);
  std::filesystem::__cxx11::path::~path((path *)&handler);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pathToFile is: ",0xf);
  pcVar5 = pathToFile_local;
  if (pathToFile_local == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d110);
  }
  else {
    sVar6 = strlen(pathToFile_local);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::ifstream::ifstream(&in,pathToFile_local,_S_in|_S_bin);
  Helpers::readFromFile_abi_cxx11_((string *)&handler,(Helpers *)&in,_in);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&contents,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handler
            );
  if (handler.super_JHandler.url_ptr.super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)&handler.super_JHandler.MD_ptr) {
    operator_delete(handler.super_JHandler.url_ptr.
                    super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&((handler.super_JHandler.MD_ptr.
                                     super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id)._M_dataplus._M_p + 1));
  }
  formpost = (curl_httppost *)0x0;
  lastptr = (curl_httppost *)0x0;
  curl_global_init(3);
  curl_formadd(&formpost,&lastptr,1,"cache-control:",4,"no-cache",0x11);
  curl_formadd(&formpost,&lastptr,1,"content-type:",4,"multipart/form-data",0x11);
  curl_formadd(&formpost,&lastptr,1,"file",0xb,filename._M_dataplus._M_p,0xc,
               contents._M_dataplus._M_p,0xd,contents._M_string_length,0x11);
  lVar3 = curl_easy_init();
  uVar4 = curl_slist_append(0,"pragma:");
  if (lVar3 != 0) {
    curl_easy_setopt(lVar3,0x2712,"https://api.anonfiles.com/upload");
    curl_easy_setopt(lVar3,0x4e2b,writeCallback);
    curl_easy_setopt(lVar3,0x2711,&data);
    curl_easy_setopt(lVar3,0x2728,formpost);
    iVar1 = curl_easy_perform(lVar3);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error, check your internet connection [",0x27);
      pcVar5 = (char *)curl_easy_strerror(iVar1);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d258);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]\n",2);
      uVar8 = 0;
      goto LAB_00106b11;
    }
    curl_easy_cleanup(lVar3);
    curl_formfree(formpost);
    curl_slist_free_all(uVar4);
  }
  curl_global_cleanup();
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,data._M_dataplus._M_p,
             data._M_dataplus._M_p + data._M_string_length);
  JHandler::JHandler(&handler.super_JHandler,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  printRequestData(&handler);
  uVar8 = (this->super_JHandler).status;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)handler.super_JHandler.error_msg._M_dataplus._M_p !=
      &handler.super_JHandler.error_msg.field_2) {
    operator_delete(handler.super_JHandler.error_msg._M_dataplus._M_p,
                    handler.super_JHandler.error_msg.field_2._M_allocated_capacity + 1);
  }
  if (handler.super_JHandler.MD_ptr.
      super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (handler.super_JHandler.MD_ptr.
               super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (handler.super_JHandler.url_ptr.super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (handler.super_JHandler.url_ptr.
               super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
LAB_00106b11:
  std::ifstream::~ifstream(&in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)contents._M_dataplus._M_p != &contents.field_2) {
    operator_delete(contents._M_dataplus._M_p,
                    CONCAT71(contents.field_2._M_allocated_capacity._1_7_,
                             contents.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data._M_dataplus._M_p != &data.field_2) {
    operator_delete(data._M_dataplus._M_p,
                    CONCAT71(data.field_2._M_allocated_capacity._1_7_,data.field_2._M_local_buf[0])
                    + 1);
  }
  return (bool)uVar8;
}

Assistant:

bool SendReceiver::uploadFile(char* pathToFile) {
  std::string data, contents;
  auto filename = fs::path(pathToFile).filename().string();

  std::cout << "pathToFile is: " << pathToFile << std::endl;

  std::ifstream in(pathToFile, std::ios::in | std::ios::binary);

  contents = Helpers::readFromFile(in);

  CURL* curl;
  CURLcode res;

  struct curl_httppost* formpost = nullptr;
  struct curl_httppost* lastptr = nullptr;
  struct curl_slist* headerlist = nullptr;

  curl_global_init(CURL_GLOBAL_ALL);

// set up the header
  curl_formadd(&formpost,
               &lastptr,
               CURLFORM_COPYNAME, "cache-control:",
               CURLFORM_COPYCONTENTS, "no-cache",
               CURLFORM_END);

  curl_formadd(&formpost,
               &lastptr,
               CURLFORM_COPYNAME, "content-type:",
               CURLFORM_COPYCONTENTS, "multipart/form-data",
               CURLFORM_END);

  curl_formadd(&formpost, &lastptr,
               CURLFORM_COPYNAME, "file",  // the (in this case) wanted file-Tag!
               CURLFORM_BUFFER, filename.c_str(),
               CURLFORM_BUFFERPTR, contents.data(),
               CURLFORM_BUFFERLENGTH, contents.size(),
               CURLFORM_END);

  curl = curl_easy_init();
  headerlist = curl_slist_append(headerlist, "pragma:");
  if (curl) {
    curl_easy_setopt(curl, CURLOPT_URL, Anonfiles::Upload);

#ifndef LINUX
    curl_easy_setopt(curl, CURLOPT_SSLCERTTYPE, "PEM");
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1L);
    curl_easy_setopt(curl, CURLOPT_CAINFO, NULL);
    curl_easy_setopt(curl, CURLOPT_CAPATH, NULL);
    curl_easy_setopt(curl, CURLOPT_FRESH_CONNECT, 1L);
    curl_easy_setopt(curl, CURLOPT_SSL_CTX_FUNCTION, *sslctx_function); // set void* and load cacert.pem from memory
#endif

    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &data);
    curl_easy_setopt(curl, CURLOPT_HTTPPOST, formpost);

    res = curl_easy_perform(curl);

    /* Check for errors */
    if (res != CURLE_OK) {
      std::cerr << "Error, check your internet connection [" << curl_easy_strerror(res) << "]\n";
      return false;
    }

#ifdef DEBUG
    std::cout << std::endl << "[DEBUG|DATA] : " << data << std::endl;
#endif

    curl_easy_cleanup(curl);
    curl_formfree(formpost);
    curl_slist_free_all(headerlist);
  }
  curl_global_cleanup();

  SendReceiver handler(data);
  handler.printRequestData();
  return status;
}